

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

void Assimp::FindMeshCenterTransformed
               (aiMesh *mesh,aiVector3D *out,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  aiVector3t<float> aVar1;
  aiVector3t<float> local_28;
  
  FindAABBTransformed(mesh,min,max,m);
  aVar1 = operator-(max,min);
  local_28.x = aVar1.x * 0.5;
  local_28.y = aVar1.y * 0.5;
  local_28.z = aVar1.z * 0.5;
  aVar1 = ::operator+(min,&local_28);
  out->x = aVar1.x;
  out->y = aVar1.y;
  out->z = aVar1.z;
  return;
}

Assistant:

void FindMeshCenterTransformed (aiMesh* mesh, aiVector3D& out, aiVector3D& min,
    aiVector3D& max, const aiMatrix4x4& m)
{
    FindAABBTransformed(mesh,min,max,m);
    out = min + (max-min)*(ai_real)0.5;
}